

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O1

ssize_t mqtt_unpack_fixed_header(mqtt_response *response,uint8_t *buf,size_t bufsz)

{
  size_t sVar1;
  uint8_t *puVar2;
  byte bVar3;
  size_t sVar4;
  int iVar5;
  MQTTControlPacketType MVar6;
  uint uVar7;
  
  sVar4 = 0xffffffff80000001;
  if ((buf != (uint8_t *)0x0 && response != (mqtt_response *)0x0) && (sVar4 = 0, bufsz != 0)) {
    MVar6 = (MQTTControlPacketType)(*buf >> 4);
    (response->fixed_header).control_type = MVar6;
    bVar3 = *buf;
    (response->fixed_header).field_0x4 = (response->fixed_header).field_0x4 & 0xf0 | bVar3 & 0xf;
    (response->fixed_header).remaining_length = 0;
    iVar5 = 0;
    sVar4 = 1;
    do {
      if (iVar5 == 0x1c) {
        return -0x7fffffe6;
      }
      if (bufsz == sVar4) {
        return 0;
      }
      uVar7 = ((buf[sVar4] & 0x7f) << ((byte)iVar5 & 0x1f)) +
              (response->fixed_header).remaining_length;
      (response->fixed_header).remaining_length = uVar7;
      iVar5 = iVar5 + 7;
      sVar1 = sVar4 + 1;
      puVar2 = buf + sVar4;
      sVar4 = sVar1;
    } while ((char)*puVar2 < '\0');
    if (mqtt_fixed_header_rules.control_type_is_valid[MVar6] == '\0') {
      sVar4 = 0xffffffff80000002;
    }
    else {
      sVar4 = 0xffffffff80000003;
      if ((mqtt_fixed_header_rules.mask_required_flags[MVar6] &
          (bVar3 & 0xf ^ mqtt_fixed_header_rules.required_flags[MVar6])) == 0) {
        sVar4 = 0;
      }
    }
    if ((sVar4 == 0) && (sVar4 = sVar1, bufsz - sVar1 < (ulong)uVar7)) {
      sVar4 = 0;
    }
  }
  return sVar4;
}

Assistant:

ssize_t mqtt_unpack_fixed_header(struct mqtt_response *response, const uint8_t *buf, size_t bufsz) {
    struct mqtt_fixed_header *fixed_header;
    const uint8_t *start = buf;
    int lshift;
    ssize_t errcode;
    
    /* check for null pointers or empty buffer */
    if (response == NULL || buf == NULL) {
        return MQTT_ERROR_NULLPTR;
    }
    fixed_header = &(response->fixed_header);

    /* check that bufsz is not zero */
    if (bufsz == 0) return 0;

    /* parse control type and flags */
    fixed_header->control_type  = (enum MQTTControlPacketType) (*buf >> 4);
    fixed_header->control_flags = (uint8_t) (*buf & 0x0F);

    /* parse remaining size */
    fixed_header->remaining_length = 0;

    lshift = 0;
    do {

        /* MQTT spec (2.2.3) says the maximum length is 28 bits */
        if(lshift == 28)
            return MQTT_ERROR_INVALID_REMAINING_LENGTH;

        /* consume byte and assert at least 1 byte left */
        --bufsz;
        ++buf;
        if (bufsz == 0) return 0;

        /* parse next byte*/
        fixed_header->remaining_length += (uint32_t) ((*buf & 0x7F) << lshift);
        lshift += 7;
    } while(*buf & 0x80); /* while continue bit is set */ 

    /* consume last byte */
    --bufsz;
    ++buf;

    /* check that the fixed header is valid */
    errcode = mqtt_fixed_header_rule_violation(fixed_header);
    if (errcode) {
        return errcode;
    }

    /* check that the buffer size if GT remaining length */
    if (bufsz < fixed_header->remaining_length) {
        return 0;
    }

    /* return how many bytes were consumed */
    return buf - start;
}